

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

mraa_aio_context mraa_aio_init(uint aio)

{
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  mraa_pininfo_t *pmVar3;
  mraa_aio_context dev;
  mraa_adv_func_t *pmVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  mraa_pin_t *pmVar9;
  int *piVar10;
  undefined1 *puVar11;
  mraa_board_t *pmVar12;
  byte bVar13;
  mraa_pin_t in_stack_ffffffffffffff08;
  int local_90 [26];
  
  pmVar12 = plat;
  bVar13 = 0;
  if (plat == (mraa_board_t *)0x0) {
    pcVar8 = "aio: Platform not initialised";
LAB_0010eadd:
    syslog(3,pcVar8);
    return (mraa_aio_context)0x0;
  }
  mVar1 = mraa_is_sub_platform_id(aio);
  if (mVar1 != 0) {
    syslog(5,"aio: Using sub platform");
    pmVar12 = pmVar12->sub_platform;
    if (pmVar12 == (mraa_board_t *)0x0) {
      pcVar8 = "aio: Sub platform Not Initialised";
      goto LAB_0010eadd;
    }
    aio = mraa_get_sub_platform_index(aio);
  }
  if ((pmVar12->aio_non_seq == 0) || ((uint)pmVar12->aio_count <= aio)) {
    uVar6 = pmVar12->gpio_count + aio;
  }
  else {
    uVar6 = pmVar12->aio_dev[aio].pin;
  }
  uVar7 = (ulong)uVar6;
  if (((int)uVar6 < 0) || (pmVar12->phy_pin_count <= (int)uVar6)) {
    pcVar8 = "aio: pin %i beyond platform definition";
  }
  else {
    if ((uint)pmVar12->aio_count <= aio) {
      pcVar8 = "aio: requested channel out of range";
      goto LAB_0010eadd;
    }
    pmVar3 = pmVar12->pins;
    if (((uint)pmVar3[uVar7].capabilities & 0x40) == 0) {
      pcVar8 = "aio: pin %i not capable of aio";
      goto LAB_0010eac4;
    }
    if (pmVar3[uVar7].aio.mux_total != 0) {
      pmVar9 = &pmVar3[uVar7].aio;
      piVar10 = local_90;
      for (lVar5 = 0x19; lVar5 != 0; lVar5 = lVar5 + -1) {
        *piVar10 = pmVar9->pinmap;
        pmVar9 = (mraa_pin_t *)((long)pmVar9 + (ulong)bVar13 * -8 + 4);
        piVar10 = piVar10 + (ulong)bVar13 * -2 + 1;
      }
      piVar10 = local_90;
      puVar11 = &stack0xffffffffffffff08;
      for (lVar5 = 100; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar11 = (char)*piVar10;
        piVar10 = (int *)((long)piVar10 + (ulong)bVar13 * -2 + 1);
        puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      }
      mVar2 = mraa_setup_mux_mapped(in_stack_ffffffffffffff08);
      if (mVar2 != MRAA_SUCCESS) {
        pcVar8 = "aio: unable to setup multiplexers for pin";
        goto LAB_0010eadd;
      }
      pmVar3 = pmVar12->pins;
    }
    pmVar4 = pmVar12->adv_func;
    uVar6 = pmVar3[uVar7].aio.pinmap;
    dev = (mraa_aio_context)calloc(1,0x18);
    if (dev != (mraa_aio_context)0x0) {
      dev->advance_func = pmVar4;
      if ((pmVar4 == (mraa_adv_func_t *)0x0) ||
         (pmVar4->aio_init_internal_replace == (_func_mraa_result_t_mraa_aio_context_int *)0x0)) {
        dev->channel = uVar6;
        mVar2 = aio_get_valid_fp(dev);
      }
      else {
        mVar2 = (*pmVar4->aio_init_internal_replace)(dev,aio);
      }
      if (mVar2 == MRAA_SUCCESS) {
        raw_bits = mraa_adc_raw_bits();
        mraa_aio_set_bit(dev,10);
        pmVar4 = dev->advance_func;
        if (pmVar4 == (mraa_adv_func_t *)0x0) {
          return dev;
        }
        if (pmVar4->aio_init_pre != (_func_mraa_result_t_uint *)0x0) {
          mVar2 = (*pmVar4->aio_init_pre)(aio);
          if (mVar2 != MRAA_SUCCESS) goto LAB_0010ec11;
          pmVar4 = dev->advance_func;
          if (pmVar4 == (mraa_adv_func_t *)0x0) {
            return dev;
          }
        }
        if (pmVar4->aio_init_post == (_func_mraa_result_t_mraa_aio_context *)0x0) {
          return dev;
        }
        mVar2 = (*pmVar4->aio_init_post)(dev);
        if (mVar2 == MRAA_SUCCESS) {
          return dev;
        }
LAB_0010ec11:
        free(dev);
        return (mraa_aio_context)0x0;
      }
      free(dev);
    }
    pcVar8 = "aio: Insufficient memory for specified input channel %d";
    uVar7 = (ulong)aio;
  }
LAB_0010eac4:
  syslog(3,pcVar8,uVar7);
  return (mraa_aio_context)0x0;
}

Assistant:

mraa_aio_context
mraa_aio_init(unsigned int aio)
{
    mraa_board_t* board = plat;
    int pin;
    if (board == NULL) {
        syslog(LOG_ERR, "aio: Platform not initialised");
        return NULL;
    }
    if (mraa_is_sub_platform_id(aio)) {
        syslog(LOG_NOTICE, "aio: Using sub platform");
        board = board->sub_platform;
        if (board == NULL) {
            syslog(LOG_ERR, "aio: Sub platform Not Initialised");
            return NULL;
        }
        aio = mraa_get_sub_platform_index(aio);
    }

    // Some boards, like the BBB, don't have sequential AIO pins
    // They will have their own specific mapping to map aio -> pin
    if((board->aio_non_seq) && (aio < board->aio_count)){
        pin = board->aio_dev[aio].pin;
    } else {
        // aio are always past the gpio_count in the pin array
        pin = aio + board->gpio_count;
    }

    if (pin < 0 || pin >= board->phy_pin_count) {
        syslog(LOG_ERR, "aio: pin %i beyond platform definition", pin);
        return NULL;
    }
    if (aio >= board->aio_count) {
        syslog(LOG_ERR, "aio: requested channel out of range");
        return NULL;
    }
    if (board->pins[pin].capabilities.aio != 1) {
        syslog(LOG_ERR, "aio: pin %i not capable of aio", pin);
        return NULL;
    }
    if (board->pins[pin].aio.mux_total > 0) {
        if (mraa_setup_mux_mapped(board->pins[pin].aio) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: unable to setup multiplexers for pin");
            return NULL;
        }
    }

    // Create ADC device connected to specified channel
    mraa_aio_context dev = mraa_aio_init_internal(board->adv_func, aio, board->pins[pin].aio.pinmap);
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: Insufficient memory for specified input channel %d", aio);
        return NULL;
    }

    raw_bits = mraa_adc_raw_bits();
    mraa_aio_set_bit(dev, DEFAULT_BITS);

    if (IS_FUNC_DEFINED(dev, aio_init_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->aio_init_pre(aio));
        if (pre_ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    if (IS_FUNC_DEFINED(dev, aio_init_post)) {
        mraa_result_t ret = dev->advance_func->aio_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}